

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseBuilder::runPasses(BaseBuilder *this)

{
  Zone *this_00;
  uint uVar1;
  ErrorHandler *errorHandler;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  Error err;
  Error EVar5;
  char *message;
  long lVar6;
  PostponedErrorHandler postponed;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar5 = 5;
  }
  else if (*(int *)&this->field_0x170 == 0) {
    EVar5 = 0;
  }
  else {
    errorHandler = (this->super_BaseEmitter)._errorHandler;
    PostponedErrorHandler::PostponedErrorHandler(&postponed);
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,&postponed.super_ErrorHandler);
    lVar2 = *(long *)&this->_passes;
    uVar1 = *(uint *)&this->field_0x170;
    this_00 = &this->_passZone;
    lVar6 = 0;
    do {
      if ((ulong)uVar1 << 3 == lVar6) {
        err = 0;
        break;
      }
      plVar3 = *(long **)(lVar2 + lVar6);
      Zone::reset(this_00,kSoft);
      err = (**(code **)(*plVar3 + 0x10))(plVar3,this_00,(this->super_BaseEmitter)._logger);
      lVar6 = lVar6 + 8;
    } while (err == 0);
    EVar5 = 0;
    Zone::reset(this_00,kSoft);
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,errorHandler);
    if (err != 0) {
      message = &postponed.field_0x9;
      uVar4 = (ulong)(byte)postponed._message;
      if (0x1e < (ulong)(byte)postponed._message) {
        message = (char *)postponed._32_8_;
        uVar4 = postponed._16_8_;
      }
      if (uVar4 == 0) {
        message = (char *)0x0;
      }
      EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,err,message);
    }
    PostponedErrorHandler::~PostponedErrorHandler(&postponed);
  }
  return EVar5;
}

Assistant:

Error BaseBuilder::runPasses() {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (_passes.empty())
    return kErrorOk;

  ErrorHandler* prev = errorHandler();
  PostponedErrorHandler postponed;

  Error err = kErrorOk;
  setErrorHandler(&postponed);

  for (Pass* pass : _passes) {
    _passZone.reset();
    err = pass->run(&_passZone, _logger);
    if (err)
      break;
  }
  _passZone.reset();
  setErrorHandler(prev);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err, !postponed._message.empty() ? postponed._message.data() : nullptr);

  return kErrorOk;
}